

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O0

void Minisat::sort<int,Minisat::LessThan_default<int>>(long param_1,int param_2)

{
  int y;
  undefined4 uVar1;
  bool bVar2;
  int j;
  int i;
  int tmp;
  int pivot;
  int local_28;
  int local_24;
  LessThan_default<int> local_1;
  
  if (param_2 < 0x10) {
    selectionSort<int,Minisat::LessThan_default<int>>(param_1,param_2);
  }
  else if (param_2 < 0x21) {
    y = *(int *)(param_1 + (long)(param_2 / 2) * 4);
    local_24 = -1;
    local_28 = param_2;
    while( true ) {
      do {
        local_24 = local_24 + 1;
        bVar2 = LessThan_default<int>::operator()(&local_1,*(int *)(param_1 + (long)local_24 * 4),y)
        ;
      } while (bVar2);
      do {
        local_28 = local_28 + -1;
        bVar2 = LessThan_default<int>::operator()(&local_1,y,*(int *)(param_1 + (long)local_28 * 4))
        ;
      } while (bVar2);
      if (local_28 <= local_24) break;
      uVar1 = *(undefined4 *)(param_1 + (long)local_24 * 4);
      *(undefined4 *)(param_1 + (long)local_24 * 4) = *(undefined4 *)(param_1 + (long)local_28 * 4);
      *(undefined4 *)(param_1 + (long)local_28 * 4) = uVar1;
    }
    sort<int,Minisat::LessThan_default<int>>(param_1,local_24);
    sort<int,Minisat::LessThan_default<int>>(param_1 + (long)local_24 * 4,param_2 - local_24);
  }
  else {
    mergesort<int,Minisat::LessThan_default<int>>(param_1,param_2);
  }
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}